

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O2

void __thiscall
rsg::ConditionalStatement::execute(ConditionalStatement *this,ExecutionContext *execCtx)

{
  Scalar extraout_var;
  int i;
  long lVar1;
  ExecConstValueAccess value;
  ExecValueAccess trueMask;
  ExecMaskStorage tmp;
  ExecMaskStorage maskStorage;
  
  (*this->m_condition->_vptr_Expression[4])();
  ExecMaskStorage::ExecMaskStorage(&maskStorage,true);
  trueMask = ExecMaskStorage::getValue(&maskStorage);
  tmp.m_data[0].intVal = (*this->m_condition->_vptr_Expression[5])();
  tmp.m_data[1].intVal = extraout_var.intVal;
  StridedValueAccess<64>::operator=(&trueMask,(StridedValueRead<64> *)&tmp);
  ExecutionContext::andExecutionMask(execCtx,trueMask.super_ConstStridedValueAccess<64>);
  (*this->m_trueStatement->_vptr_Statement[4])(this->m_trueStatement,execCtx);
  ExecutionContext::popExecutionMask(execCtx);
  if (this->m_falseStatement != (Statement *)0x0) {
    ExecMaskStorage::ExecMaskStorage(&tmp,true);
    value = (ExecConstValueAccess)ExecMaskStorage::getValue(&tmp);
    for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
      value.m_value[lVar1].boolVal =
           (bool)(trueMask.super_ConstStridedValueAccess<64>.m_value[lVar1].boolVal ^ 1);
    }
    ExecutionContext::andExecutionMask(execCtx,value);
    (*this->m_falseStatement->_vptr_Statement[4])(this->m_falseStatement,execCtx);
    ExecutionContext::popExecutionMask(execCtx);
  }
  return;
}

Assistant:

void ConditionalStatement::execute (ExecutionContext& execCtx) const
{
	// Evaluate condition
	m_condition->evaluate(execCtx);

	ExecMaskStorage	maskStorage; // Value might change when we are evaluating true block so we have to take a copy.
	ExecValueAccess	trueMask	= maskStorage.getValue();

	trueMask = m_condition->getValue().value();

	// And mask, execute true statement and pop
	execCtx.andExecutionMask(trueMask);
	m_trueStatement->execute(execCtx);
	execCtx.popExecutionMask();

	if (m_falseStatement)
	{
		// Construct negated mask, execute false statement and pop
		ExecMaskStorage tmp;
		ExecValueAccess	falseMask = tmp.getValue();

		for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			falseMask.asBool(i) = !trueMask.asBool(i);

		execCtx.andExecutionMask(falseMask);
		m_falseStatement->execute(execCtx);
		execCtx.popExecutionMask();
	}
}